

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

QByteArray *
makeCookieHeader(QByteArray *__return_storage_ptr__,QList<QNetworkCookie> *cookies,RawForm type,
                QByteArrayView separator)

{
  QNetworkCookie *cookie;
  QNetworkCookie *this;
  long lVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (cookies->d).size;
  if (lVar1 != 0) {
    this = (cookies->d).ptr;
    lVar1 = lVar1 << 3;
    do {
      QNetworkCookie::toRawForm(&local_50,this,type);
      QByteArray::append(__return_storage_ptr__);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        }
      }
      QVar2.m_data = (storage_type *)separator.m_size;
      QVar2.m_size = (__return_storage_ptr__->d).size;
      QByteArray::insert((longlong)__return_storage_ptr__,QVar2);
      this = this + 1;
      lVar1 = lVar1 + -8;
    } while (lVar1 != 0);
  }
  if ((__return_storage_ptr__->d).size != 0) {
    QByteArray::chop((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray makeCookieHeader(const QList<QNetworkCookie> &cookies,
                                   QNetworkCookie::RawForm type,
                                   QByteArrayView separator)
{
    QByteArray result;
    for (const QNetworkCookie &cookie : cookies) {
        result += cookie.toRawForm(type);
        result += separator;
    }
    if (!result.isEmpty())
        result.chop(separator.size());
    return result;
}